

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O3

void receive_wkr(VIface *iface)

{
  initializer_list<viface::VIface_*> __l;
  MyDispatcher printer;
  set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_> ifaces;
  allocator_type local_91;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  undefined4 local_6c;
  _Any_data local_68;
  code *local_58;
  _Rb_tree<viface::VIface_*,_viface::VIface_*,_std::_Identity<viface::VIface_*>,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
  local_48;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_90;
  local_90._M_unused._0_8_ = (undefined8)iface;
  std::set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>::set
            ((set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
              *)&local_48,__l,(less<viface::VIface_*> *)&local_6c,&local_91);
  local_6c = 0;
  local_90._8_8_ = 0;
  local_90._M_unused._M_object = operator_new(0x18);
  *(code **)local_90._M_unused._0_8_ = MyDispatcher::handler;
  *(undefined8 *)((long)local_90._M_unused._0_8_ + 8) = 0;
  *(less<viface::VIface_*> **)((long)local_90._M_unused._0_8_ + 0x10) =
       (less<viface::VIface_*> *)&local_6c;
  local_78 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_std::_Bind<bool_(MyDispatcher::*(MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>_>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_std::_Bind<bool_(MyDispatcher::*(MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>_>
             ::_M_manager;
  if (quit == 0) {
    do {
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
      ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_68,
                 (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                  *)&local_90);
      viface::dispatch(&local_48,&local_68,1000);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
    } while (quit == 0);
    if (local_80 == (code *)0x0) goto LAB_001045b6;
  }
  (*local_80)(&local_90,&local_90,__destroy_functor);
LAB_001045b6:
  std::
  _Rb_tree<viface::VIface_*,_viface::VIface_*,_std::_Identity<viface::VIface_*>,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void receive_wkr(viface::VIface* iface)
{
    set<viface::VIface*> ifaces = {iface};
    MyDispatcher printer;
    viface::dispatcher_cb mycb = bind(
        &MyDispatcher::handler,
        &printer,
        placeholders::_1,
        placeholders::_2,
        placeholders::_3
        );

    while (!quit) {
        // We configure a dispatcher with a timeout of 1 second
        viface::dispatch(ifaces, mycb, 1000);
    }
}